

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O2

void __thiscall SpecificStrategy::process(SpecificStrategy *this)

{
  ofstream *poVar1;
  CFG *a;
  Addr addr;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  CFG *b;
  _Base_ptr p_Var5;
  SpecificStrategy *this_00;
  Stats bStats;
  Stats aStats;
  anon_struct_96_2_3bc8cf49 total;
  Report report;
  int local_4f4;
  Stats local_4e8;
  Stats local_4b8;
  undefined1 *local_488;
  Stats local_480;
  Stats local_450;
  _Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_> local_420;
  Report local_3f0;
  
  local_480._vptr_Stats = (_func_int **)&PTR__Stats_00118ce8;
  local_480.instrs = 0;
  local_480.blocks.perfect = 0;
  local_480.blocks.conflict = 0;
  local_480.phantoms = 0;
  local_480.edges.internal.perfect = 0;
  local_480.edges.internal.conflict = 0;
  local_480.edges.external.perfect = 0;
  local_480.edges.external.conflict = 0;
  local_480.calls = 0;
  local_480.indirects = 0;
  local_450._vptr_Stats = (_func_int **)&PTR__Stats_00118ce8;
  local_450.calls = 0;
  local_450.indirects = 0;
  local_450.instrs = 0;
  local_450.blocks.perfect = 0;
  local_450.blocks.conflict = 0;
  local_450.phantoms = 0;
  local_450.edges.internal.perfect = 0;
  local_450.edges.internal.conflict = 0;
  local_450.edges.external.perfect = 0;
  local_450.edges.external.conflict = 0;
  poVar1 = &(this->super_Strategy).m_fout;
  local_488 = &(this->super_Strategy).field_0xd8;
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    poVar4 = std::operator<<((ostream *)poVar1,"cfg,type,instrs,blocks_perfect,blocks_conflict,");
    poVar4 = std::operator<<(poVar4,"phantoms,");
    poVar4 = std::operator<<(poVar4,"edges_internal_perfect,edges_internal_conflict,");
    poVar4 = std::operator<<(poVar4,"edges_external_perfect,edges_external_conflict,");
    poVar4 = std::operator<<(poVar4,"calls,indirect");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  CFGsContainer::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&local_420,
                      (this->super_Strategy).m_a);
  local_4f4 = 0;
  for (p_Var5 = local_420._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &local_420._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    a = *(CFG **)(p_Var5 + 1);
    if (a->m_status == VALID) {
      addr = a->m_addr;
      bVar3 = Strategy::isAddrInRange(&this->super_Strategy,addr);
      if (bVar3) {
        b = CFGsContainer::cfg((this->super_Strategy).m_b,addr);
        if ((b != (CFG *)0x0) && (b->m_status == VALID)) {
          this_00 = this;
          compareCFGs(&local_3f0,this,a,b);
          extractStats(&local_4b8,this_00,&local_3f0.present);
          extractStats(&local_4e8,this_00,&local_3f0.missing);
          if ((this->super_Strategy).m_config.detailed == true) {
            *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffffb5
                 | 8;
            poVar4 = std::operator<<((ostream *)&std::cout,"CFG 0x");
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::endl<char,std::char_traits<char>>(poVar4);
            *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffffb5
                 | 2;
            poVar4 = std::operator<<((ostream *)&std::cout,"present: ");
            operator<<(poVar4,&local_4b8);
            std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<((ostream *)&std::cout,"missing: ");
            operator<<(poVar4,&local_4e8);
            std::endl<char,std::char_traits<char>>(poVar4);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
          cVar2 = std::__basic_file<char>::is_open();
          if (cVar2 != '\0') {
            poVar4 = std::operator<<((ostream *)poVar1,"0x");
            *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                 *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                 *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar4 = std::operator<<(poVar4,",present,");
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_4b8.instrs);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_4b8.blocks.perfect)
            ;
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar4,local_4b8.blocks.conflict);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_4b8.phantoms);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar4,local_4b8.edges.internal.perfect);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar4,local_4b8.edges.internal.conflict);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar4,local_4b8.edges.external.perfect);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar4,local_4b8.edges.external.conflict);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_4b8.calls);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_4b8.indirects);
            std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<((ostream *)poVar1,"0x");
            *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                 *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                 *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar4 = std::operator<<(poVar4,",missing,");
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_4e8.instrs);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_4e8.blocks.perfect)
            ;
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar4,local_4e8.blocks.conflict);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_4e8.phantoms);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar4,local_4e8.edges.internal.perfect);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar4,local_4e8.edges.internal.conflict);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar4,local_4e8.edges.external.perfect);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)
                     std::ostream::operator<<((ostream *)poVar4,local_4e8.edges.external.conflict);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_4e8.calls);
            poVar4 = std::operator<<(poVar4,",");
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_4e8.indirects);
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          Stats::operator+=(&local_480,&local_4b8);
          Stats::operator+=(&local_450,&local_4e8);
          local_4f4 = local_4f4 + 1;
          Report::~Report(&local_3f0);
        }
      }
    }
  }
  std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
  ~_Rb_tree(&local_420);
  if ((this->super_Strategy).m_config.detailed != false) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Total: ");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"present: cfgs(");
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,local_4f4);
  poVar4 = std::operator<<(poVar4,"), ");
  operator<<(poVar4,&local_480);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"missing: cfgs(0), ");
  operator<<(poVar4,&local_450);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void SpecificStrategy::process() {
	struct {
		SpecificStrategy::Stats present, missing;
	} total;

	if (m_fout.is_open())
		m_fout << "cfg,type,instrs,blocks_perfect,blocks_conflict,"
		       << "phantoms,"
		       << "edges_internal_perfect,edges_internal_conflict,"
			   << "edges_external_perfect,edges_external_conflict,"
			   << "calls,indirect" << std::endl;

	int cfgs = 0;
	for (CFG* aCFG : m_a->cfgs()) {
		if (aCFG->status() != CFG::VALID)
			continue;

		Addr addr = aCFG->addr();
		if (!this->isAddrInRange(addr))
			continue;

		CFG* bCFG = m_b->cfg(addr);
		if (bCFG == 0 || bCFG->status() != CFG::VALID)
			continue;

		SpecificStrategy::Report report = compareCFGs(aCFG, bCFG);

		SpecificStrategy::Stats aStats = this->extractStats(report.present);
		SpecificStrategy::Stats bStats = this->extractStats(report.missing);

		if (m_config.detailed) {
			std::cout << std::hex;
			std::cout << "CFG 0x" << aCFG->addr() << std::endl;
			std::cout << std::dec;
			std::cout << "present: " << aStats << std::endl;
			std::cout << "missing: " << bStats << std::endl;
			std::cout << std::endl;
		}

		if (m_fout.is_open()) {
			m_fout << "0x" << std::hex << aCFG->addr() << std::dec
					<< ",present," << aStats.instrs << ","
					<< aStats.blocks.perfect << "," << aStats.blocks.conflict << ","
					<< aStats.phantoms << ","
					<< aStats.edges.internal.perfect << "," << aStats.edges.internal.conflict << ","
					<< aStats.edges.external.perfect << "," << aStats.edges.external.conflict << ","
					<< aStats.calls << "," << aStats.indirects << std::endl;

			m_fout << "0x" << std::hex << bCFG->addr() << std::dec
					<< ",missing," << bStats.instrs << ","
					<< bStats.blocks.perfect << "," << bStats.blocks.conflict << ","
					<< bStats.phantoms << ","
					<< bStats.edges.internal.perfect << "," << bStats.edges.internal.conflict << ","
					<< bStats.edges.external.perfect << "," << bStats.edges.external.conflict << ","
					<< bStats.calls << "," << bStats.indirects << std::endl;
		}

		total.present += aStats;
		total.missing += bStats;

		cfgs++;
	}

	if (m_config.detailed)
		std::cout << "Total: " << std::endl;
	std::cout << "present: cfgs(" << cfgs << "), " << total.present << std::endl;
	std::cout << "missing: cfgs(0), " << total.missing << std::endl;
}